

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int dupedExprSize(Expr *p)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  
  iVar4 = 0;
  do {
    uVar1 = dupedExprStructSize(p,1);
    uVar1 = uVar1 & 0xfff;
    if (((p->flags & 0x800) == 0) && ((p->u).zToken != (char *)0x0)) {
      sVar3 = strlen((p->u).zToken);
      uVar1 = uVar1 + ((uint)sVar3 & 0x3fffffff) + 1;
    }
    uVar1 = uVar1 + 7 & 0xfffffff8;
    if (p->pLeft != (Expr *)0x0) {
      iVar2 = dupedExprSize(p->pLeft);
      uVar1 = iVar2 + uVar1;
    }
    iVar4 = iVar4 + uVar1;
    p = p->pRight;
  } while (p != (Expr *)0x0);
  return iVar4;
}

Assistant:

static int dupedExprSize(const Expr *p){
  int nByte;
  assert( p!=0 );
  nByte = dupedExprNodeSize(p, EXPRDUP_REDUCE);
  if( p->pLeft ) nByte += dupedExprSize(p->pLeft);
  if( p->pRight ) nByte += dupedExprSize(p->pRight);
  assert( nByte==ROUND8(nByte) );
  return nByte;
}